

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_or.h
# Opt level: O0

void __thiscall
mp::
OrConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ConvertCtxPos(OrConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                *this,ItemType_conflict14 *disj,int param_3)

{
  vector<double,_std::allocator<double>_> *this_00;
  FunctionalConstraint *in_RSI;
  LinTerms *in_RDI;
  NodeRange NVar1;
  vector<double,_std::allocator<double>_> ones;
  Arguments flags;
  Arguments *args;
  value_type_conflict *in_stack_fffffffffffffe18;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe20;
  allocator_type *in_stack_fffffffffffffe28;
  undefined1 *__n;
  undefined1 fSort;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *this_01;
  AlgConRhs<1> in_stack_fffffffffffffe50;
  AlgConRhs<1> local_1a0;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe68;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe70;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe80;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe88;
  LinTerms *in_stack_fffffffffffffe90;
  undefined1 local_71;
  undefined8 local_70;
  int local_3c;
  undefined8 local_20;
  FunctionalConstraint *local_10;
  
  local_10 = in_RSI;
  local_20 = CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>
             ::GetArguments((CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>
                             *)(in_RSI + 1));
  this_01 = (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *)&stack0xffffffffffffffc8;
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  local_3c = FunctionalConstraint::GetResultVar(local_10);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe20,
             (value_type *)in_stack_fffffffffffffe18);
  this_00 = (vector<double,_std::allocator<double>_> *)
            std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_20);
  local_70 = 0x3ff0000000000000;
  __n = &local_71;
  std::allocator<double>::allocator((allocator<double> *)0x21afac);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_RDI,(size_type)__n,
             (value_type_conflict *)this_00,in_stack_fffffffffffffe28);
  fSort = (undefined1)((ulong)__n >> 0x38);
  std::allocator<double>::~allocator((allocator<double> *)0x21afda);
  std::vector<double,_std::allocator<double>_>::push_back
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *)in_RDI);
  LinTerms::LinTerms(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  AlgConRhs<1>::AlgConRhs(&local_1a0,0.0);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::AlgebraicConstraint
            (this_01,in_RDI,in_stack_fffffffffffffe50,(bool)fSort);
  NVar1 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
          ::AddConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>
                    ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                      *)in_stack_fffffffffffffe50.rhs_,this_01);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::~AlgebraicConstraint
            ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *)NVar1.pvn_);
  LinTerms::~LinTerms((LinTerms *)NVar1.pvn_);
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  return;
}

Assistant:

void ConvertCtxPos(const ItemType& disj, int ) {
    const auto& args = disj.GetArguments();
    auto flags = args;
    flags.push_back(disj.GetResultVar());
    std::vector<double> ones(args.size(), 1.0);  // res <= sum(args) in CTX+
    ones.push_back(-1.0);
    GetMC().AddConstraint(
                   LinConGE({ones, flags}, {0.0} ));
  }